

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_>::GetNode
          (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this,
          FString *key)

{
  TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *pTVar1;
  TValueTraits<FMissingCount> local_49;
  TValueTraits<FMissingCount> traits;
  FString local_30;
  TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *local_28;
  Node *n;
  FString *key_local;
  TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *this_local;
  
  n = (Node *)key;
  key_local = (FString *)this;
  FString::FString(&local_30,key);
  pTVar1 = (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *)
           FindKey(this,&local_30);
  FString::~FString(&local_30);
  this_local = pTVar1;
  if (pTVar1 == (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *)
                0x0) {
    local_28 = pTVar1;
    FString::FString((FString *)&stack0xffffffffffffffb8,key);
    local_28 = (TMap<FString,_FMissingCount,_THashTraits<FString>,_TValueTraits<FMissingCount>_> *)
               NewKey(this,(FString *)&stack0xffffffffffffffb8);
    FString::~FString((FString *)&stack0xffffffffffffffb8);
    TValueTraits<FMissingCount>::Init(&local_49,(FMissingCount *)&local_28->Size);
    this_local = local_28;
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}